

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_revsurface.cpp
# Opt level: O2

ON_Curve * __thiscall ON_RevSurface::IsoCurve(ON_RevSurface *this,int dir,double c)

{
  ON_Line *this_00;
  ON_3dVector *this_01;
  ON_3dVector *v;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  ON_ArcCurve *this_02;
  long lVar4;
  ON_Plane *pOVar5;
  ON_Circle *pOVar6;
  double dVar7;
  double extraout_XMM0_Qa;
  double t1;
  double in_XMM1_Qa;
  ON_3dPoint P;
  ON_3dVector local_168;
  ON_Arc arc;
  ON_Circle circle;
  ON_Curve *pOVar3;
  
  if (((uint)dir < 2) && (pOVar3 = this->m_curve, pOVar3 != (ON_Curve *)0x0)) {
    iVar2 = 1 - dir;
    if (this->m_bTransposed == false) {
      iVar2 = dir;
    }
    if (iVar2 == 0) {
      pOVar5 = &ON_Plane::World_xy;
      pOVar6 = &circle;
      for (lVar4 = 0x10; lVar4 != 0; lVar4 = lVar4 + -1) {
        (pOVar6->plane).origin.x = (pOVar5->origin).x;
        pOVar5 = (ON_Plane *)&(pOVar5->origin).y;
        pOVar6 = (ON_Circle *)&(pOVar6->plane).origin.y;
      }
      circle.radius = 1.0;
      ON_Curve::PointAt(&P,pOVar3,c);
      this_00 = &this->m_axis;
      ON_Line::ClosestPointTo((ON_3dPoint *)&arc,this_00,&P);
      circle.plane.origin.z = arc.super_ON_Circle.plane.origin.z;
      circle.plane.origin.x = arc.super_ON_Circle.plane.origin.x;
      circle.plane.origin.y = arc.super_ON_Circle.plane.origin.y;
      ON_Line::Tangent((ON_3dVector *)&arc,this_00);
      circle.plane.zaxis.z = arc.super_ON_Circle.plane.origin.z;
      circle.plane.zaxis.x = arc.super_ON_Circle.plane.origin.x;
      circle.plane.zaxis.y = arc.super_ON_Circle.plane.origin.y;
      ON_3dPoint::operator-((ON_3dVector *)&arc,&P,(ON_3dPoint *)&circle);
      this_01 = &circle.plane.xaxis;
      circle.plane.xaxis.z = arc.super_ON_Circle.plane.origin.z;
      circle.plane.xaxis.x = arc.super_ON_Circle.plane.origin.x;
      circle.plane.xaxis.y = arc.super_ON_Circle.plane.origin.y;
      circle.radius = ON_3dVector::Length(this_01);
      bVar1 = ON_3dVector::Unitize(this_01);
      v = &circle.plane.zaxis;
      if (!bVar1) {
        pOVar3 = this->m_curve;
        (*(pOVar3->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x25])(pOVar3);
        local_168.x = extraout_XMM0_Qa;
        local_168.y = in_XMM1_Qa;
        dVar7 = ON_Interval::ParameterAt((ON_Interval *)&local_168,0.5);
        ON_Curve::PointAt((ON_3dPoint *)&arc,pOVar3,dVar7);
        P.z = arc.super_ON_Circle.plane.origin.z;
        P.x = arc.super_ON_Circle.plane.origin.x;
        P.y = arc.super_ON_Circle.plane.origin.y;
        ON_Line::ClosestPointTo((ON_3dPoint *)&arc,this_00,&P);
        ON_3dPoint::operator-(&local_168,&P,(ON_3dPoint *)&arc);
        circle.plane.xaxis.z = local_168.z;
        circle.plane.xaxis.x = local_168.x;
        circle.plane.xaxis.y = local_168.y;
        bVar1 = ON_3dVector::Unitize(this_01);
        if (!bVar1) {
          ON_3dVector::PerpendicularTo(this_01,v);
        }
      }
      ON_CrossProduct((ON_3dVector *)&arc,v,this_01);
      circle.plane.yaxis.z = arc.super_ON_Circle.plane.origin.z;
      circle.plane.yaxis.x = arc.super_ON_Circle.plane.origin.x;
      circle.plane.yaxis.y = arc.super_ON_Circle.plane.origin.y;
      ON_3dVector::Unitize(&circle.plane.yaxis);
      ON_Plane::UpdateEquation(&circle.plane);
      ON_Arc::ON_Arc(&arc,&circle,(ON_Interval)*&(this->m_angle).m_t);
      this_02 = (ON_ArcCurve *)operator_new(0xc0);
      dVar7 = ON_Interval::operator[](&this->m_t,0);
      t1 = ON_Interval::operator[](&this->m_t,1);
      ON_ArcCurve::ON_ArcCurve(this_02,&arc,dVar7,t1);
      ON_Plane::~ON_Plane((ON_Plane *)&arc);
      ON_Plane::~ON_Plane(&circle.plane);
      return &this_02->super_ON_Curve;
    }
    iVar2 = (*(pOVar3->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x24])(pOVar3);
    pOVar3 = (ON_Curve *)CONCAT44(extraout_var,iVar2);
    if (pOVar3 != (ON_Curve *)0x0) {
      bVar1 = ON_Interval::operator!=(&this->m_t,&this->m_angle);
      if (bVar1) {
        dVar7 = ON_Interval::NormalizedParameterAt(&this->m_t,c);
        c = ON_Interval::ParameterAt(&this->m_angle,dVar7);
      }
      if ((c == 0.0) && (!NAN(c))) {
        return pOVar3;
      }
      ON_Line::Direction((ON_3dVector *)&arc,&this->m_axis);
      ON_Geometry::Rotate((ON_Geometry *)pOVar3,c,(ON_3dVector *)&arc,&(this->m_axis).from);
      return pOVar3;
    }
  }
  return (ON_Curve *)0x0;
}

Assistant:

ON_Curve* ON_RevSurface::IsoCurve( int dir, double c ) const
{
  if ( dir < 0 || dir > 1 || !m_curve )
    return nullptr;

  ON_Curve* crv = 0;
  
  if ( m_bTransposed )
    dir = 1-dir;

  if ( dir == 0 )
  {
    // 8 December 2003 Chuck - fix iso extraction bug
    //   when m_angle[0] != 0.
    ON_Circle circle;
    ON_3dPoint P = m_curve->PointAt(c);
    circle.plane.origin = m_axis.ClosestPointTo(P);
    circle.plane.zaxis = m_axis.Tangent();
    circle.plane.xaxis = P - circle.plane.origin;
    circle.radius = circle.plane.xaxis.Length();
    if ( !circle.plane.xaxis.Unitize() )
    {
      // 8 December 2003 Dale Lear - get valid zero radius
      //   arc/circle when revolute hits the axis.
      // First: try middle of revolute for x-axis
      P = m_curve->PointAt(m_curve->Domain().ParameterAt(0.5));
      ON_3dPoint Q = m_axis.ClosestPointTo(P);
      circle.plane.xaxis = P-Q;
      if ( !circle.plane.xaxis.Unitize() )
      {
        // Then: just use a vector perp to zaxis
        circle.plane.xaxis.PerpendicularTo(circle.plane.zaxis);
      }
    }
    circle.plane.yaxis = ON_CrossProduct( circle.plane.zaxis, circle.plane.xaxis );
    circle.plane.yaxis.Unitize();
    circle.plane.UpdateEquation();
    ON_Arc arc( circle, m_angle );
    crv = new ON_ArcCurve(arc, m_t[0], m_t[1]);
  }
  else if ( dir == 1 && m_curve )
  {
    crv = m_curve->DuplicateCurve();
    if ( crv )
    {
      double a = c;
      if ( m_t != m_angle )
      {
        double t = m_t.NormalizedParameterAt(c);
        a = m_angle.ParameterAt(t);
      }
      if ( a != 0.0 )
      {
        crv->Rotate( a, m_axis.Direction(), m_axis.from );
      }
    }
  }
  return crv;
}